

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_host.c
# Opt level: O3

void dfft_redistribute_cyclic_to_block_1d
               (int *dim,int *pdim,int ndim,int current_dim,int c0,int c1,int *pidx,int rev,
               int size_in,int *embed,cpx_t *work,cpx_t *scratch,int *rho_L,int *rho_pk0,
               int *dfft_nsend,int *dfft_nrecv,int *dfft_offset_send,int *dfft_offset_recv,
               MPI_Comm comm,int *proc_map,int row_m)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  float *pfVar9;
  int iVar10;
  uint uVar11;
  cpx_t *pcVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  
  if (c1 == c0) {
    return;
  }
  iVar6 = pdim[current_dim];
  iVar22 = (int)((long)dim[current_dim] / (long)iVar6);
  iVar1 = iVar22 * c1;
  uVar21 = iVar1 / c0 + (uint)(iVar1 / c0 == 0);
  uVar18 = (long)((ulong)(uint)(iVar22 >> 0x1f) << 0x20 |
                 (long)dim[current_dim] / (long)iVar6 & 0xffffffffU) / (long)(int)uVar21;
  iVar25 = embed[current_dim];
  uVar26 = (long)size_in / (long)iVar25 & 0xffffffff;
  iVar5 = pidx[current_dim];
  iVar2 = iVar5 / c1;
  uVar23 = (ulong)(uint)ndim;
  uVar3 = 1;
  if (ndim < 1) {
LAB_0010235f:
    pfVar9 = (float *)0x0;
    uVar17 = 0;
    do {
      dfft_nsend[uVar17] = 0;
      dfft_nrecv[uVar17] = 0;
      dfft_offset_send[uVar17] = 0;
      dfft_offset_recv[uVar17] = 0;
      uVar17 = uVar17 + 1;
    } while (uVar3 != uVar17);
  }
  else {
    pfVar9 = (float *)0x0;
    do {
      uVar3 = uVar3 * pdim[(long)pfVar9];
      pfVar9 = (float *)((long)pfVar9 + 1);
    } while ((float *)uVar23 != pfVar9);
    if (0 < (int)uVar3) goto LAB_0010235f;
  }
  iVar25 = (int)((long)size_in / (long)iVar25);
  uVar3 = iVar25 * uVar21;
  if (iVar6 < 1) {
    if ((rev != 0) && (iVar25 < (int)uVar3)) goto LAB_00102866;
  }
  else {
    uVar17 = (ulong)(uint)current_dim;
    iVar20 = 0;
    iVar19 = 0;
    do {
      iVar10 = iVar19 % c0;
      uVar14 = (long)iVar19 / (long)c1 & 0xffffffff;
      uVar11 = (int)((long)iVar19 / (long)c1) >> 0x1f;
      if (iVar22 < c0 || rev == 0) {
        uVar13 = 0;
        uVar24 = 0;
        if ((int)((long)((ulong)uVar11 << 0x20 | uVar14) / (long)(c0 / c1)) == iVar5 / c0) {
          uVar24 = (uint)((iVar5 % c0) % c1 == iVar19 % c1);
        }
        if (iVar2 / (c0 / c1) == iVar19 / c0) {
          uVar13 = (uint)(iVar10 % c1 == iVar5 % c1);
        }
        if (iVar1 < c0) {
          if ((iVar5 % c0) / iVar1 !=
              (int)((long)((ulong)uVar11 << 0x20 | uVar14) % (long)(c0 / iVar1))) {
            uVar24 = 0;
          }
          if (iVar10 / iVar1 != iVar2 % (c0 / iVar1)) {
            uVar13 = 0;
          }
          goto LAB_0010252d;
        }
LAB_00102543:
        iVar4 = ((int)((long)((ulong)uVar11 << 0x20 | uVar14) % (long)(c0 / c1)) * iVar1) / c0;
      }
      else {
        uVar24 = (uint)((int)((long)((ulong)uVar11 << 0x20 | uVar14) % (long)(iVar6 / c0)) ==
                       rho_pk0[iVar5 / c0]);
        uVar13 = (uint)(iVar2 % (iVar6 / c0) == rho_pk0[iVar19 / c0]);
        if (c0 <= iVar1) goto LAB_00102543;
LAB_0010252d:
        uVar27 = (long)((ulong)uVar11 << 0x20 | uVar14) / (long)(c0 / iVar1);
        iVar4 = (int)((long)((ulong)(uint)((int)uVar27 >> 0x1f) << 0x20 | uVar27 & 0xffffffff) %
                     (long)iVar22);
      }
      if (rev != 0) {
        if (iVar22 < c0) {
          iVar4 = rho_L[iVar4];
        }
        else {
          iVar4 = (int)((long)((ulong)uVar11 << 0x20 | uVar14) / (long)(iVar6 / c0));
        }
      }
      if (uVar13 != 0) {
        uVar13 = uVar3;
      }
      if (row_m == 0) {
        if (ndim < 1) goto LAB_00102608;
        uVar14 = 0;
        iVar8 = 0;
        do {
          iVar16 = iVar19;
          if (uVar17 != uVar14) {
            iVar16 = pidx[uVar14];
          }
          iVar8 = iVar8 * pdim[uVar14] + iVar16;
          uVar14 = uVar14 + 1;
        } while (uVar23 != uVar14);
      }
      else if (ndim < 1) {
LAB_00102608:
        iVar8 = 0;
      }
      else {
        iVar8 = 0;
        lVar15 = uVar23 + 1;
        do {
          iVar16 = iVar19;
          if (lVar15 - uVar17 != 2) {
            iVar16 = pidx[lVar15 + -2];
          }
          iVar8 = iVar8 * pdim[lVar15 + -2] + iVar16;
          lVar15 = lVar15 + -1;
        } while (1 < lVar15);
      }
      iVar4 = iVar4 * iVar25 * 8;
      if (uVar24 == 0) {
        iVar4 = 0;
      }
      iVar8 = proc_map[iVar8];
      dfft_offset_send[iVar8] = iVar4;
      pfVar9 = (float *)proc_map;
      iVar4 = iVar20;
      if ((rev != 0) && (pfVar9 = (float *)((long)c0 % (long)c1 & 0xffffffff), c0 / c1 < iVar22)) {
        iVar10 = iVar10 * iVar25 * iVar22;
        iVar4 = iVar10 / c0;
        pfVar9 = (float *)((long)iVar10 % (long)c0 & 0xffffffff);
      }
      dfft_offset_recv[iVar8] = iVar4 << 3;
      if (uVar24 != 0) {
        uVar24 = uVar3 * 8;
      }
      dfft_nsend[iVar8] = uVar24;
      dfft_nrecv[iVar8] = uVar13 * 8;
      iVar20 = iVar20 + uVar13;
      iVar19 = iVar19 + 1;
    } while (iVar19 != iVar6);
    if ((rev != 0) && (iVar25 < (int)uVar3)) {
      if (0 < iVar6) {
        uVar18 = (ulong)iVar25;
        iVar5 = 0;
        iVar22 = 0;
        do {
          if (row_m == 0) {
            if (ndim < 1) goto LAB_0010278f;
            uVar14 = 0;
            iVar1 = 0;
            do {
              iVar2 = iVar22;
              if (uVar17 != uVar14) {
                iVar2 = pidx[uVar14];
              }
              iVar1 = iVar1 * pdim[uVar14] + iVar2;
              uVar14 = uVar14 + 1;
            } while (uVar23 != uVar14);
          }
          else if (ndim < 1) {
LAB_0010278f:
            iVar1 = 0;
          }
          else {
            iVar1 = 0;
            lVar15 = uVar23 + 1;
            do {
              iVar2 = iVar22;
              if (lVar15 - uVar17 != 2) {
                iVar2 = pidx[lVar15 + -2];
              }
              iVar1 = iVar1 * pdim[lVar15 + -2] + iVar2;
              lVar15 = lVar15 + -1;
            } while (1 < lVar15);
          }
          iVar1 = proc_map[iVar1];
          iVar2 = dfft_offset_send[iVar1];
          dfft_offset_send[iVar1] = iVar25 * 8 * iVar5;
          pfVar9 = (float *)((long)dfft_nsend[iVar1] % (long)iVar25 & 0xffffffff);
          uVar3 = dfft_nsend[iVar1] / iVar25 >> 3;
          if (0 < (int)uVar3) {
            pfVar9 = (float *)((long)&scratch->x + (long)iVar5 * uVar18 * 8);
            uVar14 = 0;
            do {
              if (0 < iVar25) {
                uVar27 = 0;
                do {
                  *(cpx_t *)(pfVar9 + uVar27 * 2) =
                       work[(uVar14 * (long)c0 + (long)(int)(((ulong)(long)iVar2 >> 3) / uVar18)) *
                            uVar18 + uVar27];
                  uVar27 = uVar27 + 1;
                } while (uVar26 != uVar27);
              }
              uVar14 = uVar14 + 1;
              pfVar9 = pfVar9 + uVar18 * 2;
            } while (uVar14 != uVar3);
          }
          iVar5 = iVar5 + uVar3;
          iVar22 = iVar22 + 1;
        } while (iVar22 != iVar6);
      }
LAB_00102866:
      MPI_Barrier(comm,pdim,pfVar9);
      MPI_Alltoallv(scratch,dfft_nsend,dfft_offset_send,&ompi_mpi_byte,work,dfft_nrecv,
                    dfft_offset_recv,&ompi_mpi_byte,comm);
      return;
    }
  }
  MPI_Barrier(comm,pdim,pfVar9);
  MPI_Alltoallv(work,dfft_nsend,dfft_offset_send,&ompi_mpi_byte,scratch,dfft_nrecv,dfft_offset_recv,
                &ompi_mpi_byte,comm);
  if (0 < (int)uVar18) {
    lVar15 = (long)iVar25 * 8;
    uVar23 = 0;
    do {
      iVar6 = (int)uVar23 * c1 + iVar5 % c1;
      if (rev == 0 || iVar22 < c0) {
        iVar6 = iVar6 / c1;
        lVar7 = (long)(c0 / c1);
      }
      else {
        iVar6 = (iVar6 * iVar22) / c0;
        lVar7 = 1;
      }
      if (0 < (int)uVar21) {
        pfVar9 = (float *)((long)&work->x + iVar6 * lVar15);
        uVar17 = 0;
        pcVar12 = scratch;
        do {
          if (0 < iVar25) {
            uVar14 = 0;
            do {
              *(cpx_t *)(pfVar9 + uVar14 * 2) = pcVar12[uVar14];
              uVar14 = uVar14 + 1;
            } while (uVar26 != uVar14);
          }
          uVar17 = uVar17 + 1;
          pfVar9 = (float *)((long)pfVar9 + lVar7 * lVar15);
          pcVar12 = pcVar12 + iVar25;
        } while (uVar17 != uVar21);
      }
      uVar23 = uVar23 + 1;
      scratch = scratch + (int)uVar3;
    } while (uVar23 != (uVar18 & 0xffffffff));
  }
  return;
}

Assistant:

void dfft_redistribute_cyclic_to_block_1d(int *dim,
                     int *pdim,
                     int ndim,
                     int current_dim,
                     int c0,
                     int c1,
                     int* pidx,
                     int rev,
                     int size_in,
                     int *embed,
                     cpx_t *work,
                     cpx_t *scratch,
                     int *rho_L,
                     int *rho_pk0,
                     int *dfft_nsend,
                     int *dfft_nrecv,
                     int *dfft_offset_send,
                     int *dfft_offset_recv,
                     MPI_Comm comm,
                     int *proc_map,
                     int row_m)
    {
    if (c1 == c0) return;

    /* length along current dimension */
    int length = dim[current_dim]/pdim[current_dim];
    int size = length*c1/c0;
    size = (size ? size : 1);
    int npackets = length/size;

    int stride = size_in/embed[current_dim];

    /* processor index along current dimension */
    int s=pidx[current_dim];
    /* number of procs along current dimension */
    int p=pdim[current_dim];

    size *= stride;

    int offset = 0;
    int recv_size,send_size;
    int j0_local = s%c0;
    int j2_local = s/c0;
    int j0_new_local = s%c1;
    int j2_new_local = s/c1;

    int pdim_tot=1;
    int k;
    for (k = 0; k < ndim; ++k)
        pdim_tot *= pdim[k];

    int i;
    for (i = 0; i < pdim_tot; ++i)
        {
        dfft_nsend[i] = 0;
        dfft_nrecv[i] = 0;
        dfft_offset_send[i] = 0;
        dfft_offset_recv[i] = 0;
        }

    for (i = 0; i < p; ++i)
        {
        int j0_remote = i%c0;
        int j2_remote = i/c0;

        int j0_new_remote = i % c1;
        int j2_new_remote = i/c1;

        /* decision to send and/or receive */
        int send = 0;
        int recv = 0;
        if (rev && (length >= c0))
            {
            /* redistribute into block with reversed processor id
               and swapped-partially reversed local order (the c0 LSB
               of the local index are MSB, and the n/p/c0 MSB
               are LSB and are reversed */
            send = (((j2_new_remote % (p/c0)) == (rho_pk0[j2_local])) ? 1 : 0);
            recv = (((j2_new_local % (p/c0)) == (rho_pk0[j2_remote])) ? 1 : 0);
            }
        else
            {
            send = (((j2_new_remote / (c0/c1)) == j2_local) && ((j0_local % c1)==j0_new_remote) ? 1 : 0); 
            recv = (((j2_new_local / (c0/c1)) == j2_remote) &&  ((j0_remote % c1)==j0_new_local) ? 1 : 0);

            if (length*c1 < c0)
                {
                send &= (j0_local/(length*c1) == j2_new_remote % (c0/(length*c1)));
                recv &= (j0_remote/(length*c1) == j2_new_local % (c0/(length*c1)));
                }
            }

        /* offset of first element sent */
        int j1;
        if (length*c1 >= c0)
            {
            j1 = (j2_new_remote % (c0/c1))*length*c1/c0;
            }
        else
            {
            j1 = (j2_new_remote / (c0/(length*c1))) % length;
            }

        if (rev)
            {
            if (length >= c0)
                {
                j1 = j2_new_remote/(p/c0);
                }
            else
                j1 = rho_L[j1];
            }

        /* mirror remote decision to send */
        send_size = (send ? size : 0);
        recv_size = (recv ? size : 0);

        int destproc = 0;
        int k;
        if (row_m)
            {
            for (k = ndim-1; k >=0 ;--k)
                {
                destproc *= pdim[k];
                destproc += ((current_dim == k) ? i : pidx[k]);
                }
            }
        else
            {
            for (k = 0; k < ndim; ++k)
                {
                destproc *= pdim[k];
                destproc += ((current_dim == k) ? i : pidx[k]);
                }
            }

        int rank = proc_map[destproc];

        dfft_offset_send[rank] = (send ? (stride*j1*sizeof(cpx_t)) : 0);
        if (rev && (length > c0/c1))
            {
            /* we are directly receving into the work buf */
            dfft_offset_recv[rank] = stride*j0_remote*length/c0*sizeof(cpx_t);
            }
        else
            {
            dfft_offset_recv[rank] = offset*sizeof(cpx_t);
            }

        dfft_nsend[rank] = send_size*sizeof(cpx_t);
        dfft_nrecv[rank] = recv_size*sizeof(cpx_t);
        offset += (recv ? size : 0);
        }

    /* we need to pack data if the local input buffer is reversed
       and we are sending more than one element */
    if (rev && (size > stride))
        {
        offset = 0;
        /*#pragma omp ... */
        int i;
        for (i = 0; i <p; ++i)
            {
            int destproc = 0;
            int k;
            if (row_m)
                {
                for (k = ndim-1; k >=0 ;--k)
                    {
                    destproc *= pdim[k];
                    destproc += ((current_dim == k) ? i : pidx[k]);
                    }
                }
            else
                {
                for (k = 0; k < ndim; ++k)
                    {
                    destproc *= pdim[k];
                    destproc += ((current_dim == k) ? i : pidx[k]);
                    }
                }

            int rank = proc_map[destproc];

            int j1_offset = dfft_offset_send[rank]/sizeof(cpx_t)/stride;

            /* we are sending from a tmp buffer/stride */
            dfft_offset_send[rank] = offset*sizeof(cpx_t)*stride;
            int n = dfft_nsend[rank]/stride/sizeof(cpx_t);
            int j;
            for (j = 0; j < n; j++)
                for (k = 0; k < stride; ++ k)
                    scratch[(offset+j)*stride+k] = work[(j1_offset+j*c0)*stride+k];

            offset += n;
            }

        /* perform communication */
        MPI_Barrier(comm);
        MPI_Alltoallv(scratch,dfft_nsend, dfft_offset_send, MPI_BYTE,
                      work, dfft_nrecv, dfft_offset_recv, MPI_BYTE,
                      comm);
        }
    else
        {
        /* perform communication */
        MPI_Barrier(comm);
        MPI_Alltoallv(work,dfft_nsend, dfft_offset_send, MPI_BYTE,
                      scratch, dfft_nrecv, dfft_offset_recv, MPI_BYTE,
                      comm);

        /* unpack */
        int r;
        #pragma omp parallel for private(r)
        for (r = 0; r < npackets; ++r)
            {
            int j1, j1_offset, del;
            int j0_remote = j0_new_local + r*c1;
            if (rev && (length >= c0))
                {
                j1_offset = j0_remote*length/c0;
                del = 1;
                }
            else
                {
                j1_offset = j0_remote/c1;
                del = c0/c1;
                }
            int j;
            for (j = 0; j < (size/stride); ++j)
                {
                j1 = j1_offset + j*del;
                int k;
                for (k = 0; k < stride; ++k)
                    work[j1*stride+k] = scratch[r*size+j*stride+k];
                }
            }
        }
    }